

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::weight(vector<float,_std::allocator<float>_> *__return_storage_ptr__,MXNetNode *this,
                 int i,int init_len)

{
  int iVar1;
  pointer piVar2;
  pointer pMVar3;
  pointer pMVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  value_type_conflict2 local_38;
  value_type_conflict2 local_34;
  
  if ((i < 0) ||
     (piVar2 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2) >> 2) <= i)) {
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar1 = piVar2[(uint)i];
    pMVar3 = (this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = -1;
    lVar5 = -0x38;
    do {
      lVar8 = lVar5;
      pMVar4 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 1;
      if ((int)(((long)(this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x58) <= lVar7) {
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pMVar4->init)._M_dataplus._M_p + lVar8),&pMVar3[iVar1].name);
      lVar5 = lVar8 + 0x58;
    } while (bVar6);
    if (*(long *)((long)&pMVar4[1].name._M_dataplus._M_p + lVar8) ==
        *(long *)((long)&pMVar4[1].name._M_string_length + lVar8)) {
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((init_len != 0) &&
         (*(long *)((long)&pMVar4[1].data.super__Vector_base<float,_std::allocator<float>_>._M_impl
                   + lVar8) != 0)) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&pMVar4[1].name.field_2 + lVar8 + 8U);
        bVar6 = std::operator==(__lhs,"[\\$zero\\$, {}]");
        if (bVar6) {
          local_34 = 0.0;
          std::vector<float,_std::allocator<float>_>::resize
                    (__return_storage_ptr__,(long)init_len,&local_34);
        }
        else {
          bVar6 = std::operator==(__lhs,"[\\$one\\$, {}]");
          if (bVar6) {
            local_38 = 1.0;
            std::vector<float,_std::allocator<float>_>::resize
                      (__return_storage_ptr__,(long)init_len,&local_38);
          }
        }
      }
    }
    else {
      std::vector<float,_std::allocator<float>_>::vector
                (__return_storage_ptr__,
                 (vector<float,_std::allocator<float>_> *)
                 ((long)&pMVar4[1].name._M_dataplus._M_p + lVar8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> MXNetNode::weight(int i, int init_len) const
{
    if (i < 0 || i >= (int)weights.size())
        return std::vector<float>();

    const std::string& name = (*nodes)[ weights[i] ].name;

    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name != name)
            continue;

        if (!p.data.empty())
            return p.data;

        std::vector<float> data;

        if (!p.init.empty() && init_len != 0)
        {
            if (p.init == "[\\$zero\\$, {}]")
            {
                data.resize(init_len, 0.f);
            }
            else if (p.init == "[\\$one\\$, {}]")
            {
                data.resize(init_len, 1.f);
            }
        }

        return data;
    }

    return std::vector<float>();
}